

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

void object_skin_display(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  wchar_t y;
  int iVar6;
  int in_stack_ffffffffffffffa8;
  
  x = loc->col;
  piVar5 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar5 = &menu->count;
  }
  iVar1 = *top;
  iVar3 = cursor + -1;
  if (iVar1 < 1) {
    iVar3 = iVar1;
  }
  iVar2 = loc->row;
  if (iVar1 < cursor) {
    iVar3 = iVar1;
  }
  iVar1 = loc->page_rows;
  iVar6 = (cursor - iVar1) + 2;
  if (cursor < iVar1 + iVar3 + -1) {
    iVar6 = iVar3;
  }
  iVar3 = *piVar5;
  iVar4 = iVar3 - iVar1;
  if (iVar6 < iVar4) {
    iVar4 = iVar6;
  }
  iVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  *top = iVar4;
  if (0 < iVar1) {
    do {
      y = iVar2 + iVar6;
      Term_erase(x,y,loc->width);
      if (iVar6 < iVar3) {
        display_menu_row(menu,*top + iVar6,(uint)(iVar6 == cursor - *top),SUB41(y,0),x,loc->width,
                         in_stack_ffffffffffffffa8);
      }
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(x + menu->cursor_x_offset,(iVar2 + cursor) - *top);
    return;
  }
  return;
}

Assistant:

static void object_skin_display(struct menu *menu, int cursor, int *top, region *loc)
{
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int i;

	/* Keep a certain distance from the top when possible */
	if ((cursor <= *top) && (*top > 0))
		*top = cursor - 1;

	/* Keep a certain distance from the bottom when possible */
	if (cursor >= *top + (rows_per_page - 1))
		*top = cursor - (rows_per_page - 1) + 1;

	/* Limit the top to legal places */
	*top = MIN(*top, n - rows_per_page);
	*top = MAX(*top, 0);

	for (i = 0; i < rows_per_page; i++) {
		/* Blank all lines */
		Term_erase(col, row + i, loc->width);
		if (i < n) {
			/* Redraw the line if it's within the number of menu items */
			bool is_curs = (i == cursor - *top);
			display_menu_row(menu, i + *top, *top, is_curs, row + i, col,
							loc->width);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + menu->cursor_x_offset, row + cursor - *top);
}